

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collider.cxx
# Opt level: O2

void __thiscall glauber::Collider::Collider(Collider *this,VarMap *var_map)

{
  int iVar1;
  _Head_base<0UL,_glauber::Nucleus_*,_false> _Var2;
  Nucleus *pNVar3;
  result_type __sd;
  undefined8 uVar4;
  bool bVar5;
  any *paVar6;
  int *piVar7;
  double *pdVar8;
  result_type *prVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  allocator local_59;
  double local_58;
  string local_50 [32];
  
  anon_unknown_6::create_nucleus((anon_unknown_6 *)this,var_map,0);
  anon_unknown_6::create_nucleus((anon_unknown_6 *)&this->nucleusB_,var_map,1);
  NucleonProfile::NucleonProfile(&this->nucleon_profile_,var_map);
  std::__cxx11::string::string(local_50,"number-events",&local_59);
  paVar6 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
  piVar7 = boost::any_cast<int_const&>(paVar6);
  iVar1 = *piVar7;
  std::__cxx11::string::~string(local_50);
  this->nevents_ = iVar1;
  std::__cxx11::string::string(local_50,"b-min",&local_59);
  paVar6 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
  pdVar8 = boost::any_cast<double_const&>(paVar6);
  local_58 = *pdVar8;
  std::__cxx11::string::~string(local_50);
  this->bmin_ = local_58;
  _Var2._M_head_impl =
       (this->nucleusA_)._M_t.
       super___uniq_ptr_impl<glauber::Nucleus,_std::default_delete<glauber::Nucleus>_>._M_t.
       super__Tuple_impl<0UL,_glauber::Nucleus_*,_std::default_delete<glauber::Nucleus>_>.
       super__Head_base<0UL,_glauber::Nucleus_*,_false>._M_head_impl;
  pNVar3 = (this->nucleusB_)._M_t.
           super___uniq_ptr_impl<glauber::Nucleus,_std::default_delete<glauber::Nucleus>_>._M_t.
           super__Tuple_impl<0UL,_glauber::Nucleus_*,_std::default_delete<glauber::Nucleus>_>.
           super__Head_base<0UL,_glauber::Nucleus_*,_false>._M_head_impl;
  std::__cxx11::string::string(local_50,"b-max",&local_59);
  paVar6 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
  pdVar8 = boost::any_cast<double_const&>(paVar6);
  local_58 = *pdVar8;
  std::__cxx11::string::~string(local_50);
  dVar12 = local_58;
  if (local_58 < 0.0) {
    dVar10 = (double)(**(code **)((long)(_Var2._M_head_impl)->_vptr_Nucleus + 0x10))
                               (_Var2._M_head_impl);
    local_58 = dVar10;
    (*pNVar3->_vptr_Nucleus[2])(pNVar3);
    dVar12 = (this->nucleon_profile_).max_impact_sqr_;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar12;
    if (dVar12 < 0.0) {
      local_58 = dVar10 + local_58;
      dVar11 = sqrt(dVar12);
      dVar12 = local_58;
    }
    else {
      auVar13 = vsqrtsd_avx(auVar13,auVar13);
      dVar11 = auVar13._0_8_;
      dVar12 = dVar10 + local_58;
    }
    dVar12 = dVar12 + dVar11;
  }
  this->bmax_ = dVar12;
  pNVar3 = (this->nucleusB_)._M_t.
           super___uniq_ptr_impl<glauber::Nucleus,_std::default_delete<glauber::Nucleus>_>._M_t.
           super__Tuple_impl<0UL,_glauber::Nucleus_*,_std::default_delete<glauber::Nucleus>_>.
           super__Head_base<0UL,_glauber::Nucleus_*,_false>._M_head_impl;
  dVar12 = (double)(**(code **)((long)((this->nucleusA_)._M_t.
                                       super___uniq_ptr_impl<glauber::Nucleus,_std::default_delete<glauber::Nucleus>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_glauber::Nucleus_*,_std::default_delete<glauber::Nucleus>_>
                                       .super__Head_base<0UL,_glauber::Nucleus_*,_false>.
                                      _M_head_impl)->_vptr_Nucleus + 0x10))();
  local_58 = dVar12;
  (*pNVar3->_vptr_Nucleus[2])(pNVar3);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_58 + dVar12;
  uVar4 = vcmpsd_avx512f(auVar14,ZEXT816(0x3fb999999999999a),1);
  bVar5 = (bool)((byte)uVar4 & 1);
  this->asymmetry_ =
       (double)((ulong)bVar5 * 0x3fe0000000000000 +
               (ulong)!bVar5 * (long)(local_58 / (local_58 + dVar12)));
  Event::Event(&this->event_,var_map);
  Output::Output(&this->output_,var_map);
  std::__cxx11::string::string(local_50,"random-seed",&local_59);
  paVar6 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
  prVar9 = (result_type *)boost::any_cast<long_const&>(paVar6);
  __sd = *prVar9;
  std::__cxx11::string::~string(local_50);
  if (0 < (long)__sd) {
    std::
    mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
    ::seed((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
            *)random::engine,__sd);
  }
  return;
}

Assistant:

Collider::Collider(const VarMap& var_map)
    : nucleusA_(create_nucleus(var_map, 0)),
      nucleusB_(create_nucleus(var_map, 1)),
      nucleon_profile_(var_map),
      nevents_(var_map["number-events"].as<int>()),
      bmin_(var_map["b-min"].as<double>()),
      bmax_(determine_bmax(var_map, *nucleusA_, *nucleusB_, nucleon_profile_)),
      asymmetry_(determine_asym(*nucleusA_, *nucleusB_)),
      event_(var_map),
      output_(var_map) {
  // Constructor body begins here.
  // Set random seed if requested.
  auto seed = var_map["random-seed"].as<int64_t>();
  if (seed > 0)
    random::engine.seed(static_cast<random::Engine::result_type>(seed));
}